

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_filter.hpp
# Opt level: O2

bool __thiscall
jsoncons::
json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
::visit_string(json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
               *this,string_view_type *value,semantic_tag tag,ser_context *context,error_code *ec)

{
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *pjVar1;
  ser_error *this_00;
  type tVar2;
  error_code eVar3;
  error_code ec_00;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> target;
  size_type local_38;
  pointer local_30;
  
  target._M_dataplus._M_p = (pointer)&target.field_2;
  target._M_string_length = 0;
  target.field_2._M_local_buf[0] = L'\0';
  tVar2 = unicode_traits::convert<char,std::__cxx11::wstring>
                    (value->_M_str,value->_M_len,&target,strict);
  if (tVar2.ec == success) {
    pjVar1 = (this->
             super_json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
             ).destination1_;
    local_38 = target._M_string_length;
    local_30 = target._M_dataplus._M_p;
    (*(pjVar1->super_basic_json_visitor<wchar_t>)._vptr_basic_json_visitor[0xc])
              (pjVar1,&local_38,(ulong)tag,context,ec);
    std::__cxx11::wstring::~wstring((wstring *)&target);
    return true;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  eVar3 = unicode_traits::make_error_code(tVar2.ec);
  ec_00._M_cat = eVar3._M_cat;
  ec_00._4_4_ = 0;
  ec_00._M_value = eVar3._M_value;
  ser_error::ser_error(this_00,ec_00);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& value,
        semantic_tag tag,
        const ser_context& context,
        std::error_code& ec) override
    {
        std::basic_string<typename To::char_type> target;
        auto result = unicode_traits::convert(value.data(), value.size(),
                                              target,unicode_traits::conv_flags::strict);
        if (result.ec != unicode_traits::conv_errc())
        {
            JSONCONS_THROW(ser_error(result.ec));
        }
        return destination().string_value(target, tag, context, ec);
    }